

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void LogTextV(ImGuiContext *g,char *fmt,__va_list_tag *args)

{
  char *count;
  ImU64 in_RDX;
  void *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  ImVector<char> *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x53e0) == 0) {
    ImGuiTextBuffer::appendfv((ImGuiTextBuffer *)g,fmt,args);
  }
  else {
    ImVector<char>::resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    ImGuiTextBuffer::appendfv((ImGuiTextBuffer *)g,fmt,args);
    count = ImGuiTextBuffer::c_str((ImGuiTextBuffer *)(in_RDI + 0x53e8));
    ImGuiTextBuffer::size((ImGuiTextBuffer *)(in_RDI + 0x53e8));
    ImFileWrite(in_RSI,in_RDX,(ImU64)count,
                (ImFileHandle)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

static inline void LogTextV(ImGuiContext& g, const char* fmt, va_list args)
{
    if (g.LogFile)
    {
        g.LogBuffer.Buf.resize(0);
        g.LogBuffer.appendfv(fmt, args);
        ImFileWrite(g.LogBuffer.c_str(), sizeof(char), (ImU64)g.LogBuffer.size(), g.LogFile);
    }
    else
    {
        g.LogBuffer.appendfv(fmt, args);
    }
}